

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  Number NVar1;
  CrtAllocator *in_RCX;
  size_t in_RDX;
  Number in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *unaff_retaddr;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *chunkSize;
  
  chunkSize = in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI);
  in_RDI[1].data_.n = in_RSI;
  in_RDI[1].data_.s.str = (Ch *)0x0;
  internal::Stack<rapidjson::CrtAllocator>::Stack
            ((Stack<rapidjson::CrtAllocator> *)(in_RDI + 2),in_RCX,in_RDX);
  ParseResult::ParseResult((ParseResult *)(in_RDI + 5));
  if (in_RDI[1].data_.n.i64 == 0) {
    NVar1 = (Number)operator_new(0x18);
    MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
              (unaff_retaddr,(size_t)chunkSize,(CrtAllocator *)in_RSI);
    in_RDI[1].data_.n = NVar1;
    in_RDI[1].data_.s.str = (Ch *)NVar1;
  }
  return;
}

Assistant:

GenericDocument(Allocator* allocator = 0, size_t stackCapacity = kDefaultStackCapacity, StackAllocator* stackAllocator = 0) : 
        allocator_(allocator), ownAllocator_(0), stack_(stackAllocator, stackCapacity), parseResult_()
    {
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
    }